

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O2

idx_t duckdb::FindRangeBound<duckdb::GreaterThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  short sVar7;
  short sVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  OutOfRangeException *pOVar16;
  unsigned_long uVar17;
  unsigned_long uVar18;
  uint64_t uVar19;
  long lVar20;
  InternalException *this;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  float fVar25;
  hugeint_t hVar26;
  WindowColumnIterator<unsigned_long> WVar27;
  WindowColumnIterator<short> WVar28;
  WindowColumnIterator<unsigned_int> WVar29;
  WindowColumnIterator<signed_char> WVar30;
  WindowColumnIterator<duckdb::interval_t> WVar31;
  WindowColumnIterator<unsigned_short> WVar32;
  WindowColumnIterator<unsigned_char> WVar33;
  WindowColumnIterator<int> WVar34;
  WindowColumnIterator<double> WVar35;
  WindowColumnIterator<long> WVar36;
  WindowColumnIterator<float> WVar37;
  WindowColumnIterator<duckdb::uhugeint_t> WVar38;
  WindowColumnIterator<duckdb::hugeint_t> WVar39;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<duckdb::interval_t> __last_03;
  WindowColumnIterator<unsigned_short> __last_04;
  WindowColumnIterator<unsigned_char> __last_05;
  WindowColumnIterator<int> __last_06;
  WindowColumnIterator<double> __last_07;
  WindowColumnIterator<long> __last_08;
  WindowColumnIterator<float> __last_09;
  WindowColumnIterator<duckdb::uhugeint_t> __last_10;
  WindowColumnIterator<duckdb::hugeint_t> __last_11;
  allocator local_a1;
  interval_t second;
  uchar val;
  undefined1 auStack_77 [15];
  OperationCompare<unsigned_char,_duckdb::GreaterThan> comp;
  interval_t cur_val;
  idx_t iVar21;
  
  uVar19 = auStack_77._7_8_;
  PVar1 = boundary->ptype;
  auStack_77._7_8_ = uVar19;
  switch(PVar1) {
  case UINT8:
    bVar2 = WindowInputExpression::GetCell<unsigned_char>(boundary,chunk_idx);
    val = bVar2;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar3 = WindowCursor::GetCell<unsigned_char>(range_hi,0,order_end - 1);
      if (bVar2 < bVar3) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar3 = WindowCursor::GetCell<unsigned_char>(range_lo,0,order_begin);
      if (bVar3 < bVar2) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<unsigned_char>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        bVar3 = WindowCursor::GetCell<unsigned_char>(range_hi,0,uVar22 - 1);
        if (bVar3 <= bVar2) {
          iVar21 = prev->end;
          if (bVar2 <= bVar3) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&second,
               &comp.super_function<bool_(unsigned_char,_unsigned_char)>);
    WVar33.pos = order_begin;
    WVar33.coll = range_lo;
    __last_05.pos = order_end;
    __last_05.coll = range_hi;
    WVar33 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::GreaterThan>>
                       (WVar33,__last_05,&val,
                        (OperationCompare<unsigned_char,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar33.pos;
    break;
  case INT8:
    cVar4 = WindowInputExpression::GetCell<signed_char>(boundary,chunk_idx);
    val = cVar4;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar5 = WindowCursor::GetCell<signed_char>(range_hi,0,order_end - 1);
      if (cVar4 < cVar5) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar5 = WindowCursor::GetCell<signed_char>(range_lo,0,order_begin);
      if (cVar5 < cVar4) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<signed_char>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if ((uVar22 < order_end && order_begin < uVar22) &&
         (cVar5 = WindowCursor::GetCell<signed_char>(range_hi,0,uVar22 - 1), cVar5 <= cVar4)) {
        iVar21 = prev->end;
        if (cVar4 <= cVar5) goto LAB_00a940c9;
        order_end = iVar21 + 1;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&second,
               (function<bool_(signed_char,_signed_char)> *)&comp);
    WVar30.pos = order_begin;
    WVar30.coll = range_lo;
    __last_02.pos = order_end;
    __last_02.coll = range_hi;
    WVar30 = ::std::
             upper_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::GreaterThan>>
                       (WVar30,__last_02,(char *)&val,
                        (OperationCompare<signed_char,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar30.pos;
    break;
  case UINT16:
    uVar9 = WindowInputExpression::GetCell<unsigned_short>(boundary,chunk_idx);
    _val = uVar9;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar10 = WindowCursor::GetCell<unsigned_short>(range_hi,0,order_end - 1);
      if (uVar9 < uVar10) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar10 = WindowCursor::GetCell<unsigned_short>(range_lo,0,order_begin);
      if (uVar10 < uVar9) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<unsigned_short>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        uVar10 = WindowCursor::GetCell<unsigned_short>(range_hi,0,uVar22 - 1);
        if (uVar10 <= uVar9) {
          iVar21 = prev->end;
          if (uVar9 <= uVar10) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&second,
               (function<bool_(unsigned_short,_unsigned_short)> *)&comp);
    WVar32.pos = order_begin;
    WVar32.coll = range_lo;
    __last_04.pos = order_end;
    __last_04.coll = range_hi;
    WVar32 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::GreaterThan>>
                       (WVar32,__last_04,(unsigned_short *)&val,
                        (OperationCompare<unsigned_short,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar32.pos;
    break;
  case INT16:
    sVar7 = WindowInputExpression::GetCell<short>(boundary,chunk_idx);
    _val = sVar7;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar8 = WindowCursor::GetCell<short>(range_hi,0,order_end - 1);
      if (sVar7 < sVar8) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar8 = WindowCursor::GetCell<short>(range_lo,0,order_begin);
      if (sVar8 < sVar7) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<short>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if ((uVar22 < order_end && order_begin < uVar22) &&
         (sVar8 = WindowCursor::GetCell<short>(range_hi,0,uVar22 - 1), sVar8 <= sVar7)) {
        iVar21 = prev->end;
        if (sVar7 <= sVar8) goto LAB_00a940c9;
        order_end = iVar21 + 1;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&second,(function<bool_(short,_short)> *)&comp);
    WVar28.pos = order_begin;
    WVar28.coll = range_lo;
    __last_00.pos = order_end;
    __last_00.coll = range_hi;
    WVar28 = ::std::
             upper_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::GreaterThan>>
                       (WVar28,__last_00,(short *)&val,
                        (OperationCompare<short,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar28.pos;
    break;
  case UINT32:
    uVar11 = WindowInputExpression::GetCell<unsigned_int>(boundary,chunk_idx);
    _val = uVar11;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar12 = WindowCursor::GetCell<unsigned_int>(range_hi,0,order_end - 1);
      if (uVar11 < uVar12) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar12 = WindowCursor::GetCell<unsigned_int>(range_lo,0,order_begin);
      if (uVar12 < uVar11) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<unsigned_int>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        uVar12 = WindowCursor::GetCell<unsigned_int>(range_hi,0,uVar22 - 1);
        if (uVar12 <= uVar11) {
          iVar21 = prev->end;
          if (uVar11 <= uVar12) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&second,
               (function<bool_(unsigned_int,_unsigned_int)> *)&comp);
    WVar29.pos = order_begin;
    WVar29.coll = range_lo;
    __last_01.pos = order_end;
    __last_01.coll = range_hi;
    WVar29 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::GreaterThan>>
                       (WVar29,__last_01,(uint *)&val,
                        (OperationCompare<unsigned_int,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar29.pos;
    break;
  case INT32:
    iVar13 = WindowInputExpression::GetCell<int>(boundary,chunk_idx);
    _val = iVar13;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar14 = WindowCursor::GetCell<int>(range_hi,0,order_end - 1);
      if (iVar13 < iVar14) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar14 = WindowCursor::GetCell<int>(range_lo,0,order_begin);
      if (iVar14 < iVar13) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<int>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if ((uVar22 < order_end && order_begin < uVar22) &&
         (iVar14 = WindowCursor::GetCell<int>(range_hi,0,uVar22 - 1), iVar14 <= iVar13)) {
        iVar21 = prev->end;
        if (iVar13 <= iVar14) goto LAB_00a940c9;
        order_end = iVar21 + 1;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&second,(function<bool_(int,_int)> *)&comp);
    WVar34.pos = order_begin;
    WVar34.coll = range_lo;
    __last_06.pos = order_end;
    __last_06.coll = range_hi;
    WVar34 = ::std::
             upper_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::GreaterThan>>
                       (WVar34,__last_06,(int *)&val,
                        (OperationCompare<int,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar34.pos;
    break;
  case UINT64:
    uVar17 = WindowInputExpression::GetCell<unsigned_long>(boundary,chunk_idx);
    _val = (int)uVar17;
    auStack_77._3_4_ = (int)(uVar17 >> 0x20);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar18 = WindowCursor::GetCell<unsigned_long>(range_hi,0,order_end - 1);
      if (uVar17 < uVar18) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar18 = WindowCursor::GetCell<unsigned_long>(range_lo,0,order_begin);
      if (uVar18 < uVar17) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<unsigned_long>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        uVar18 = WindowCursor::GetCell<unsigned_long>(range_hi,0,uVar22 - 1);
        if (uVar18 <= uVar17) {
          iVar21 = prev->end;
          if (uVar17 <= uVar18) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&second,
               (function<bool_(unsigned_long,_unsigned_long)> *)&comp);
    WVar27.pos = order_begin;
    WVar27.coll = range_lo;
    __last.pos = order_end;
    __last.coll = range_hi;
    WVar27 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::GreaterThan>>
                       (WVar27,__last,(unsigned_long *)&val,
                        (OperationCompare<unsigned_long,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar27.pos;
    break;
  case INT64:
    uVar19 = WindowInputExpression::GetCell<long>(boundary,chunk_idx);
    _val = (int)uVar19;
    auStack_77._3_4_ = (int)(uVar19 >> 0x20);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar20 = WindowCursor::GetCell<long>(range_hi,0,order_end - 1);
      if ((long)uVar19 < lVar20) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar20 = WindowCursor::GetCell<long>(range_lo,0,order_begin);
      if (lVar20 < (long)uVar19) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<long>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if ((uVar22 < order_end && order_begin < uVar22) &&
         (lVar20 = WindowCursor::GetCell<long>(range_hi,0,uVar22 - 1), lVar20 <= (long)uVar19)) {
        iVar21 = prev->end;
        if ((long)uVar19 <= lVar20) goto LAB_00a940c9;
        order_end = iVar21 + 1;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&second,(function<bool_(long,_long)> *)&comp);
    WVar36.pos = order_begin;
    WVar36.coll = range_lo;
    __last_08.pos = order_end;
    __last_08.coll = range_hi;
    WVar36 = ::std::
             upper_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::GreaterThan>>
                       (WVar36,__last_08,(long *)&val,
                        (OperationCompare<long,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar36.pos;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_00a92e59_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&comp,"Unsupported column type for RANGE",(allocator *)&second);
    InternalException::InternalException(this,(string *)&comp);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar25 = WindowInputExpression::GetCell<float>(boundary,chunk_idx);
    _val = (int32_t)fVar25;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cur_val.months = (int32_t)WindowCursor::GetCell<float>(range_hi,0,order_end - 1);
      bVar6 = GreaterThan::Operation<float>((float *)&cur_val,(float *)&val);
      if (bVar6) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&second,"Invalid RANGE PRECEDING value",&local_a1);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cur_val.months = (int32_t)WindowCursor::GetCell<float>(range_lo,0,order_begin);
      bVar6 = GreaterThan::Operation<float>((float *)&val,(float *)&cur_val);
      if (bVar6) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&second,"Invalid RANGE FOLLOWING value",&local_a1);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<float>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        fVar25 = WindowCursor::GetCell<float>(range_hi,0,uVar22 - 1);
        second.months = (int32_t)fVar25;
        bVar6 = GreaterThan::Operation<float>((float *)&second,(float *)&val);
        if (!bVar6) {
          bVar6 = GreaterThan::Operation<float>((float *)&val,(float *)&second);
          iVar21 = prev->end;
          if (!bVar6) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&second,(function<bool_(float,_float)> *)&comp);
    WVar37.pos = order_begin;
    WVar37.coll = range_lo;
    __last_09.pos = order_end;
    __last_09.coll = range_hi;
    WVar37 = ::std::
             upper_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::GreaterThan>>
                       (WVar37,__last_09,(float *)&val,
                        (OperationCompare<float,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar37.pos;
    break;
  case DOUBLE:
    _val = WindowInputExpression::GetCell<double>(boundary,chunk_idx);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cur_val._0_8_ = WindowCursor::GetCell<double>(range_hi,0,order_end - 1);
      bVar6 = GreaterThan::Operation<double>((double *)&cur_val,(double *)&val);
      if (bVar6) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&second,"Invalid RANGE PRECEDING value",&local_a1);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cur_val._0_8_ = WindowCursor::GetCell<double>(range_lo,0,order_begin);
      bVar6 = GreaterThan::Operation<double>((double *)&val,(double *)&cur_val);
      if (bVar6) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&second,"Invalid RANGE FOLLOWING value",&local_a1);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<double>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        second._0_8_ = WindowCursor::GetCell<double>(range_hi,0,uVar22 - 1);
        bVar6 = GreaterThan::Operation<double>((double *)&second,(double *)&val);
        if (!bVar6) {
          bVar6 = GreaterThan::Operation<double>((double *)&val,(double *)&second);
          iVar21 = prev->end;
          if (!bVar6) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&second,(function<bool_(double,_double)> *)&comp);
    WVar35.pos = order_begin;
    WVar35.coll = range_lo;
    __last_07.pos = order_end;
    __last_07.coll = range_hi;
    WVar35 = ::std::
             upper_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::GreaterThan>>
                       (WVar35,__last_07,(double *)&val,
                        (OperationCompare<double,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar35.pos;
    break;
  case INTERVAL:
    _val = WindowInputExpression::GetCell<duckdb::interval_t>(boundary,chunk_idx);
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
         (_Manager_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
    _M_unused._M_object = (void *)0x0;
    comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_ =
         0;
    if (range == EXPR_PRECEDING_RANGE) {
      cur_val = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,order_end - 1);
      bVar6 = interval_t::operator>(&cur_val,(interval_t *)&val);
      if (bVar6) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&second,"Invalid RANGE PRECEDING value",&local_a1);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cur_val = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,order_begin);
      bVar6 = interval_t::operator>((interval_t *)&val,&cur_val);
      if (bVar6) {
        pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&second,"Invalid RANGE FOLLOWING value",&local_a1);
        OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
        __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar15 = prev->start;
    uVar22 = prev->end;
    if (uVar15 < uVar22) {
      if (uVar15 < order_end && order_begin <= uVar15) {
        WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,uVar15);
        uVar22 = prev->end;
      }
      if (uVar22 < order_end && order_begin < uVar22) {
        second = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,uVar22 - 1);
        bVar6 = interval_t::operator>(&second,(interval_t *)&val);
        if (!bVar6) {
          bVar6 = interval_t::operator>((interval_t *)&val,&second);
          iVar21 = prev->end;
          if (!bVar6) goto LAB_00a940c9;
          order_end = iVar21 + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
              ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&second,
               (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&comp);
    WVar31.pos = order_begin;
    WVar31.coll = range_lo;
    __last_03.pos = order_end;
    __last_03.coll = range_hi;
    WVar31 = ::std::
             upper_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::GreaterThan>>
                       (WVar31,__last_03,(interval_t *)&val,
                        (OperationCompare<duckdb::interval_t,_duckdb::GreaterThan> *)&second);
    iVar21 = WVar31.pos;
    break;
  default:
    if (PVar1 == UINT128) {
      _val = (interval_t)WindowInputExpression::GetCell<duckdb::uhugeint_t>(boundary,chunk_idx);
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
           (_Manager_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
      _M_unused._M_object = (void *)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_
           = 0;
      if (range == EXPR_PRECEDING_RANGE) {
        cur_val = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,order_end - 1);
        bVar6 = uhugeint_t::operator>((uhugeint_t *)&cur_val,(uhugeint_t *)&val);
        if (bVar6) {
          pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&second,"Invalid RANGE PRECEDING value",&local_a1);
          OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
          __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        cur_val = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,order_begin);
        bVar6 = uhugeint_t::operator>((uhugeint_t *)&val,(uhugeint_t *)&cur_val);
        if (bVar6) {
          pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&second,"Invalid RANGE FOLLOWING value",&local_a1);
          OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
          __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar15 = prev->start;
      uVar22 = prev->end;
      if (uVar15 < uVar22) {
        if (uVar15 < order_end && order_begin <= uVar15) {
          WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,uVar15);
          uVar22 = prev->end;
        }
        if (uVar22 < order_end && order_begin < uVar22) {
          second = (interval_t)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,uVar22 - 1);
          bVar6 = uhugeint_t::operator>((uhugeint_t *)&second,(uhugeint_t *)&val);
          if (!bVar6) {
            bVar6 = uhugeint_t::operator>((uhugeint_t *)&val,(uhugeint_t *)&second);
            iVar21 = prev->end;
            if (!bVar6) goto LAB_00a940c9;
            order_end = iVar21 + 1;
          }
        }
      }
      ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
                ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&second,
                 (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&comp);
      WVar38.pos = order_begin;
      WVar38.coll = range_lo;
      __last_10.pos = order_end;
      __last_10.coll = range_hi;
      WVar38 = ::std::
               upper_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::GreaterThan>>
                         (WVar38,__last_10,(uhugeint_t *)&val,
                          (OperationCompare<duckdb::uhugeint_t,_duckdb::GreaterThan> *)&second);
      iVar21 = WVar38.pos;
    }
    else {
      if (PVar1 != INT128) goto switchD_00a92e59_caseD_a;
      _val = (interval_t)WindowInputExpression::GetCell<duckdb::hugeint_t>(boundary,chunk_idx);
      lVar20 = val._8_8_;
      uVar15 = (ulong)val;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_manager =
           (_Manager_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>._M_invoker = (_Invoker_type)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor.
      _M_unused._M_object = (void *)0x0;
      comp.super_function<bool_(unsigned_char,_unsigned_char)>.super__Function_base._M_functor._8_8_
           = 0;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,order_end - 1);
        if ((lVar20 < hVar26.upper) || (uVar15 < hVar26.lower && hVar26.upper == lVar20)) {
          pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&second,"Invalid RANGE PRECEDING value",(allocator *)&cur_val);
          OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
          __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,order_begin);
        if ((hVar26.upper < lVar20) || (hVar26.lower < uVar15 && lVar20 == hVar26.upper)) {
          pOVar16 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&second,"Invalid RANGE FOLLOWING value",(allocator *)&cur_val);
          OutOfRangeException::OutOfRangeException(pOVar16,(string *)&second);
          __cxa_throw(pOVar16,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar22 = prev->start;
      uVar23 = prev->end;
      if (uVar22 < uVar23) {
        if (uVar22 < order_end && order_begin <= uVar22) {
          WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,uVar22);
          uVar23 = prev->end;
        }
        if (uVar23 < order_end && order_begin < uVar23) {
          hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,uVar23 - 1);
          lVar24 = hVar26.upper;
          if ((lVar24 <= lVar20) && (hVar26.lower <= uVar15 || lVar24 != lVar20)) {
            iVar21 = prev->end;
            if ((lVar20 <= lVar24) && (uVar15 <= hVar26.lower || lVar24 != lVar20))
            goto LAB_00a940c9;
            order_end = iVar21 + 1;
          }
        }
      }
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&second,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&comp);
      WVar39.pos = order_begin;
      WVar39.coll = range_lo;
      __last_11.pos = order_end;
      __last_11.coll = range_hi;
      WVar39 = ::std::
               upper_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::GreaterThan>>
                         (WVar39,__last_11,(hugeint_t *)&val,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::GreaterThan> *)&second);
      iVar21 = WVar39.pos;
    }
  }
  ::std::_Function_base::~_Function_base((_Function_base *)&second);
LAB_00a940c9:
  ::std::_Function_base::~_Function_base((_Function_base *)&comp);
  return iVar21;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}